

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcTendonAnchor::~IfcTendonAnchor(IfcTendonAnchor *this)

{
  ~IfcTendonAnchor((IfcTendonAnchor *)
                   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.
                    super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                    field_0x28);
  return;
}

Assistant:

IfcTendonAnchor() : Object("IfcTendonAnchor") {}